

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lib_ffi.c
# Opt level: O0

int lj_cf_ffi_meta___newindex(lua_State *L)

{
  TValue *pTVar1;
  TValue *o;
  uint8_t *p;
  CType *ct;
  CTState *pCStack_30;
  CTInfo qual;
  CTState *cts;
  lua_State *L_local;
  CTState *local_18;
  CTState *cts_1;
  
  pCStack_30 = *(CTState **)((L->glref).ptr64 + 0x180);
  pCStack_30->L = L;
  ct._4_4_ = 0;
  pTVar1 = L->base;
  cts = (CTState *)L;
  local_18 = pCStack_30;
  cts_1 = (CTState *)L;
  if ((pTVar1 + 2 < L->top) && ((int)(pTVar1->field_4).it >> 0xf == -0xb)) {
    p = (uint8_t *)
        lj_cdata_index(pCStack_30,(GCcdata *)(pTVar1->u64 & 0x7fffffffffff),pTVar1 + 1,
                       (uint8_t **)&o,(CTInfo *)((long)&ct + 4));
    if ((ct._4_4_ & 1) == 0) {
      lj_cdata_set(pCStack_30,(CType *)p,(uint8_t *)&o->u64,pTVar1 + 2,ct._4_4_);
      L_local._4_4_ = 0;
    }
    else {
      if ((ct._4_4_ & 0x2000000) != 0) {
        lj_err_caller((lua_State *)cts,LJ_ERR_FFI_WRCONST);
      }
      L_local._4_4_ = ffi_index_meta((lua_State *)cts,pCStack_30,(CType *)p,MM_newindex);
    }
    return L_local._4_4_;
  }
  lj_err_argt(L,1,10);
}

Assistant:

LJLIB_CF(ffi_meta___newindex)	LJLIB_REC(cdata_index 1)
{
  CTState *cts = ctype_cts(L);
  CTInfo qual = 0;
  CType *ct;
  uint8_t *p;
  TValue *o = L->base;
  if (!(o+2 < L->top && tviscdata(o)))  /* Also checks for key and value. */
    lj_err_argt(L, 1, LUA_TCDATA);
  ct = lj_cdata_index(cts, cdataV(o), o+1, &p, &qual);
  if ((qual & 1)) {
    if ((qual & CTF_CONST))
      lj_err_caller(L, LJ_ERR_FFI_WRCONST);
    return ffi_index_meta(L, cts, ct, MM_newindex);
  }
  lj_cdata_set(cts, ct, p, o+2, qual);
  return 0;
}